

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O2

void __thiscall Assimp::DeboneProcess::UpdateNode(DeboneProcess *this,aiNode *pNode)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer ppVar5;
  long lVar6;
  long lVar7;
  pointer __src;
  pointer puVar8;
  uint uVar9;
  uint *__dest;
  uint a;
  ulong uVar10;
  uint a_1;
  ulong uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newMeshList;
  
  newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar2 = (this->mSubMeshIndices).
           super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (this->mSubMeshIndices).
           super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = pNode->mNumMeshes;
  for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    uVar1 = pNode->mMeshes[uVar10];
    pvVar4 = (this->mSubMeshIndices).
             super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = *(pointer *)
              ((long)&pvVar4[uVar1].
                      super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    lVar6 = *(long *)&pvVar4[uVar1].
                      super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                      ._M_impl.super__Vector_impl_data;
    for (uVar11 = 0; ((long)ppVar5 - lVar6 & 0xffffffff0U) != uVar11; uVar11 = uVar11 + 0x10) {
      lVar7 = *(long *)&pvVar4[uVar1].
                        super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                        ._M_impl.super__Vector_impl_data;
      if (*(long *)(lVar7 + 8 + uVar11) == 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&newMeshList,(value_type_conflict1 *)(lVar7 + uVar11));
      }
    }
  }
  for (uVar10 = 0; uVar10 != (((long)pvVar2 - (long)pvVar3) / 0x18 & 0xffffffffU);
      uVar10 = uVar10 + 1) {
    pvVar4 = (this->mSubMeshIndices).
             super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = *(pointer *)
              ((long)&pvVar4[uVar10].
                      super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    lVar6 = *(long *)&pvVar4[uVar10].
                      super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                      ._M_impl.super__Vector_impl_data;
    for (uVar11 = 0; ((long)ppVar5 - lVar6 & 0xffffffff0U) != uVar11; uVar11 = uVar11 + 0x10) {
      lVar7 = *(long *)&pvVar4[uVar10].
                        super__Vector_base<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                        ._M_impl.super__Vector_impl_data;
      if (*(aiNode **)(lVar7 + 8 + uVar11) == pNode) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&newMeshList,(value_type_conflict1 *)(lVar7 + uVar11));
      }
    }
  }
  if (pNode->mNumMeshes != 0) {
    if (pNode->mMeshes != (uint *)0x0) {
      operator_delete__(pNode->mMeshes);
    }
    pNode->mMeshes = (uint *)0x0;
  }
  puVar8 = newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src = newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
  uVar10 = (long)newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
  uVar9 = (uint)(uVar10 >> 2);
  pNode->mNumMeshes = uVar9;
  if (uVar9 != 0) {
    __dest = (uint *)operator_new__(uVar10 & 0x3fffffffc);
    pNode->mMeshes = __dest;
    if (puVar8 != __src) {
      memmove(__dest,__src,uVar10);
    }
  }
  for (uVar10 = 0; uVar10 < pNode->mNumChildren; uVar10 = uVar10 + 1) {
    UpdateNode(this,pNode->mChildren[uVar10]);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void DeboneProcess::UpdateNode(aiNode* pNode) const
{
    // rebuild the node's mesh index list

    std::vector<unsigned int> newMeshList;

    // this will require two passes

    unsigned int m = static_cast<unsigned int>(pNode->mNumMeshes), n = static_cast<unsigned int>(mSubMeshIndices.size());

    // first pass, look for meshes which have not moved

    for(unsigned int a=0;a<m;a++)   {

        unsigned int srcIndex = pNode->mMeshes[a];
        const std::vector< std::pair< unsigned int,aiNode* > > &subMeshes = mSubMeshIndices[srcIndex];
        unsigned int nSubmeshes = static_cast<unsigned int>(subMeshes.size());

        for(unsigned int b=0;b<nSubmeshes;b++) {
            if(!subMeshes[b].second) {
                newMeshList.push_back(subMeshes[b].first);
            }
        }
    }

    // second pass, collect deboned meshes

    for(unsigned int a=0;a<n;a++)
    {
        const std::vector< std::pair< unsigned int,aiNode* > > &subMeshes = mSubMeshIndices[a];
        unsigned int nSubmeshes = static_cast<unsigned int>(subMeshes.size());

        for(unsigned int b=0;b<nSubmeshes;b++) {
            if(subMeshes[b].second == pNode)    {
                newMeshList.push_back(subMeshes[b].first);
            }
        }
    }

    if( pNode->mNumMeshes > 0 ) {
        delete [] pNode->mMeshes; pNode->mMeshes = NULL;
    }

    pNode->mNumMeshes = static_cast<unsigned int>(newMeshList.size());

    if(pNode->mNumMeshes)   {
        pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
        std::copy( newMeshList.begin(), newMeshList.end(), pNode->mMeshes);
    }

    // do that also recursively for all children
    for( unsigned int a = 0; a < pNode->mNumChildren; ++a ) {
        UpdateNode( pNode->mChildren[a]);
    }
}